

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_concept_suite.cpp
# Opt level: O1

void reversible_container_suite::run(void)

{
  return;
}

Assistant:

void run()
{
    container_types();
    // Required member functions are check elsewhere
    //   variable::rbegin()
    //   variable::rend()
    //   variable::crbegin()
    //   variable::crend()
}